

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O0

Status __thiscall
leveldb::DBImpl::RecoverLogFile
          (DBImpl *this,uint64_t log_number,bool last_log,bool *save_manifest,VersionEdit *edit,
          SequenceNumber *max_sequence)

{
  Logger *info_log;
  bool bVar1;
  int iVar2;
  size_t sVar3;
  VersionEdit *this_00;
  SequenceNumber SVar4;
  undefined8 uVar5;
  Writer *this_01;
  MemTable *this_02;
  undefined7 in_register_00000011;
  uint64_t number;
  ulong *in_stack_00000008;
  bool local_253;
  bool local_1f2;
  undefined1 local_1c0 [40];
  uint64_t lfile_size;
  Comparator *local_190;
  SequenceNumber last_seq;
  Slice local_180;
  Slice local_170;
  Status local_160;
  VersionEdit *local_158;
  MemTable *mem;
  undefined1 local_148 [4];
  int compactions;
  WriteBatch batch;
  Slice record;
  string scratch;
  undefined1 local_f8 [8];
  Reader reader;
  LogReporter reporter;
  MemTable *local_60;
  SequentialFile *file;
  string fname;
  VersionEdit *edit_local;
  bool *save_manifest_local;
  bool last_log_local;
  uint64_t log_number_local;
  DBImpl *this_local;
  Status *status;
  
  number = CONCAT71(in_register_00000011,last_log);
  port::Mutex::AssertHeld((Mutex *)(log_number + 200));
  LogFileName((leveldb *)&file,(string *)(log_number + 0x98),number);
  (**(code **)(**(long **)(log_number + 8) + 0x10))
            (this,*(long **)(log_number + 8),(leveldb *)&file,&local_60);
  bVar1 = Status::ok((Status *)this);
  if (bVar1) {
    RecoverLogFile::LogReporter::LogReporter((LogReporter *)&reader.resyncing_);
    std::__cxx11::string::c_str();
    log::Reader::Reader((Reader *)local_f8,(SequentialFile *)local_60,(Reporter *)&reader.resyncing_
                        ,true,0);
    Log(*(Logger **)(log_number + 0x48),"Recovering log #%llu",number);
    std::__cxx11::string::string((string *)&record.size_);
    Slice::Slice((Slice *)&batch.field_0x18);
    WriteBatch::WriteBatch((WriteBatch *)local_148);
    mem._4_4_ = 0;
    local_158 = (VersionEdit *)0x0;
    do {
      do {
        while( true ) {
          bVar1 = log::Reader::ReadRecord
                            ((Reader *)local_f8,(Slice *)&batch.field_0x18,(string *)&record.size_);
          local_1f2 = false;
          if (bVar1) {
            local_1f2 = Status::ok((Status *)this);
          }
          if (local_1f2 == false) goto LAB_0010b6b8;
          sVar3 = Slice::size((Slice *)&batch.field_0x18);
          if (0xb < sVar3) break;
          sVar3 = Slice::size((Slice *)&batch.field_0x18);
          Slice::Slice(&local_170,"log record too small");
          Slice::Slice(&local_180);
          Status::Corruption(&local_160,&local_170,&local_180);
          RecoverLogFile(unsigned_long,bool,bool*,leveldb::VersionEdit*,unsigned_long*)::LogReporter
          ::Corruption(unsigned_long,leveldb::Status_const__(&reader.resyncing_,sVar3,&local_160);
          Status::~Status(&local_160);
        }
        WriteBatchInternal::SetContents((WriteBatch *)local_148,(Slice *)&batch.field_0x18);
        if (local_158 == (VersionEdit *)0x0) {
          this_00 = (VersionEdit *)operator_new(0x70);
          MemTable::MemTable((MemTable *)this_00,(InternalKeyComparator *)(log_number + 0x10));
          local_158 = this_00;
          MemTable::Ref((MemTable *)this_00);
        }
        WriteBatchInternal::InsertInto
                  ((WriteBatchInternal *)&last_seq,(WriteBatch *)local_148,(MemTable *)local_158);
        Status::operator=((Status *)this,(Status *)&last_seq);
        Status::~Status((Status *)&last_seq);
        MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
        bVar1 = Status::ok((Status *)this);
        if (!bVar1) goto LAB_0010b6b8;
        SVar4 = WriteBatchInternal::Sequence((WriteBatch *)local_148);
        iVar2 = WriteBatchInternal::Count((WriteBatch *)local_148);
        local_190 = (Comparator *)((SVar4 + (long)iVar2) - 1);
        if ((Comparator *)*in_stack_00000008 < local_190) {
          *in_stack_00000008 = (ulong)local_190;
        }
        sVar3 = MemTable::ApproximateMemoryUsage((MemTable *)local_158);
      } while (sVar3 <= *(ulong *)(log_number + 0x50));
      mem._4_4_ = mem._4_4_ + 1;
      edit->comparator_ = (string)0x1;
      WriteLevel0Table((DBImpl *)&lfile_size,(MemTable *)log_number,local_158,
                       (Version *)max_sequence);
      Status::operator=((Status *)this,(Status *)&lfile_size);
      Status::~Status((Status *)&lfile_size);
      MemTable::Unref((MemTable *)local_158);
      local_158 = (VersionEdit *)0x0;
      bVar1 = Status::ok((Status *)this);
    } while (bVar1);
LAB_0010b6b8:
    if (local_60 != (MemTable *)0x0) {
      (*(local_60->comparator_).comparator.super_Comparator._vptr_Comparator[1])();
    }
    bVar1 = Status::ok((Status *)this);
    if ((((bVar1) && ((*(byte *)(log_number + 0x84) & 1) != 0)) && (((ulong)save_manifest & 1) != 0)
        ) && (mem._4_4_ == 0)) {
      if (*(long *)(log_number + 0x148) != 0) {
        __assert_fail("logfile_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1ca,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x158) != 0) {
        __assert_fail("log_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1cb,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      if (*(long *)(log_number + 0x130) != 0) {
        __assert_fail("mem_ == nullptr",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_impl.cc"
                      ,0x1cc,
                      "Status leveldb::DBImpl::RecoverLogFile(uint64_t, bool, bool *, VersionEdit *, SequenceNumber *)"
                     );
      }
      local_1c0[0xf] = 0;
      (**(code **)(**(long **)(log_number + 8) + 0x58))
                (local_1c0 + 0x18,*(long **)(log_number + 8),&file,local_1c0 + 0x20);
      bVar1 = Status::ok((Status *)(local_1c0 + 0x18));
      local_253 = false;
      if (bVar1) {
        (**(code **)(**(long **)(log_number + 8) + 0x28))
                  (local_1c0 + 0x10,*(long **)(log_number + 8),&file,log_number + 0x148);
        local_1c0[0xf] = 1;
        local_253 = Status::ok((Status *)(local_1c0 + 0x10));
      }
      if ((local_1c0[0xf] & 1) != 0) {
        Status::~Status((Status *)(local_1c0 + 0x10));
      }
      Status::~Status((Status *)(local_1c0 + 0x18));
      if (local_253 != false) {
        info_log = *(Logger **)(log_number + 0x48);
        uVar5 = std::__cxx11::string::c_str();
        Log(info_log,"Reusing old log %s \n",uVar5);
        this_01 = (Writer *)operator_new(0x20);
        log::Writer::Writer(this_01,*(WritableFile **)(log_number + 0x148),local_1c0._32_8_);
        *(Writer **)(log_number + 0x158) = this_01;
        *(uint64_t *)(log_number + 0x150) = number;
        if (local_158 == (VersionEdit *)0x0) {
          this_02 = (MemTable *)operator_new(0x70);
          MemTable::MemTable(this_02,(InternalKeyComparator *)(log_number + 0x10));
          *(MemTable **)(log_number + 0x130) = this_02;
          MemTable::Ref(*(MemTable **)(log_number + 0x130));
        }
        else {
          *(VersionEdit **)(log_number + 0x130) = local_158;
          local_158 = (VersionEdit *)0x0;
        }
      }
    }
    if (local_158 != (VersionEdit *)0x0) {
      bVar1 = Status::ok((Status *)this);
      if (bVar1) {
        edit->comparator_ = (string)0x1;
        WriteLevel0Table((DBImpl *)local_1c0,(MemTable *)log_number,local_158,
                         (Version *)max_sequence);
        Status::operator=((Status *)this,(Status *)local_1c0);
        Status::~Status((Status *)local_1c0);
      }
      MemTable::Unref((MemTable *)local_158);
    }
    WriteBatch::~WriteBatch((WriteBatch *)local_148);
    std::__cxx11::string::~string((string *)&record.size_);
    log::Reader::~Reader((Reader *)local_f8);
    RecoverLogFile::LogReporter::~LogReporter((LogReporter *)&reader.resyncing_);
  }
  else {
    MaybeIgnoreError((DBImpl *)log_number,(Status *)this);
  }
  std::__cxx11::string::~string((string *)&file);
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::RecoverLogFile(uint64_t log_number, bool last_log,
                              bool* save_manifest, VersionEdit* edit,
                              SequenceNumber* max_sequence) {
  struct LogReporter : public log::Reader::Reporter {
    Env* env;
    Logger* info_log;
    const char* fname;
    Status* status;  // null if options_.paranoid_checks==false
    void Corruption(size_t bytes, const Status& s) override {
      Log(info_log, "%s%s: dropping %d bytes; %s",
          (this->status == nullptr ? "(ignoring error) " : ""), fname,
          static_cast<int>(bytes), s.ToString().c_str());
      if (this->status != nullptr && this->status->ok()) *this->status = s;
    }
  };

  mutex_.AssertHeld();

  // Open the log file
  std::string fname = LogFileName(dbname_, log_number);
  SequentialFile* file;
  Status status = env_->NewSequentialFile(fname, &file);
  if (!status.ok()) {
    MaybeIgnoreError(&status);
    return status;
  }

  // Create the log reader.
  LogReporter reporter;
  reporter.env = env_;
  reporter.info_log = options_.info_log;
  reporter.fname = fname.c_str();
  reporter.status = (options_.paranoid_checks ? &status : nullptr);
  // We intentionally make log::Reader do checksumming even if
  // paranoid_checks==false so that corruptions cause entire commits
  // to be skipped instead of propagating bad information (like overly
  // large sequence numbers).
  log::Reader reader(file, &reporter, true /*checksum*/, 0 /*initial_offset*/);
  Log(options_.info_log, "Recovering log #%llu",
      (unsigned long long)log_number);

  // Read all the records and add to a memtable
  std::string scratch;
  Slice record;
  WriteBatch batch;
  int compactions = 0;
  MemTable* mem = nullptr;
  while (reader.ReadRecord(&record, &scratch) && status.ok()) {
    if (record.size() < 12) {
      reporter.Corruption(record.size(),
                          Status::Corruption("log record too small"));
      continue;
    }
    WriteBatchInternal::SetContents(&batch, record);

    if (mem == nullptr) {
      mem = new MemTable(internal_comparator_);
      mem->Ref();
    }
    status = WriteBatchInternal::InsertInto(&batch, mem);
    MaybeIgnoreError(&status);
    if (!status.ok()) {
      break;
    }
    const SequenceNumber last_seq = WriteBatchInternal::Sequence(&batch) +
                                    WriteBatchInternal::Count(&batch) - 1;
    if (last_seq > *max_sequence) {
      *max_sequence = last_seq;
    }

    if (mem->ApproximateMemoryUsage() > options_.write_buffer_size) {
      compactions++;
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
      mem->Unref();
      mem = nullptr;
      if (!status.ok()) {
        // Reflect errors immediately so that conditions like full
        // file-systems cause the DB::Open() to fail.
        break;
      }
    }
  }

  delete file;

  // See if we should keep reusing the last log file.
  if (status.ok() && options_.reuse_logs && last_log && compactions == 0) {
    assert(logfile_ == nullptr);
    assert(log_ == nullptr);
    assert(mem_ == nullptr);
    uint64_t lfile_size;
    if (env_->GetFileSize(fname, &lfile_size).ok() &&
        env_->NewAppendableFile(fname, &logfile_).ok()) {
      Log(options_.info_log, "Reusing old log %s \n", fname.c_str());
      log_ = new log::Writer(logfile_, lfile_size);
      logfile_number_ = log_number;
      if (mem != nullptr) {
        mem_ = mem;
        mem = nullptr;
      } else {
        // mem can be nullptr if lognum exists but was empty.
        mem_ = new MemTable(internal_comparator_);
        mem_->Ref();
      }
    }
  }

  if (mem != nullptr) {
    // mem did not get reused; compact it.
    if (status.ok()) {
      *save_manifest = true;
      status = WriteLevel0Table(mem, edit, nullptr);
    }
    mem->Unref();
  }

  return status;
}